

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManEquivDeriveReprs(Gia_Man_t *p,Gia_Man_t *pNew,Gia_Man_t *pFinal)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  Gia_Rpr_t *pGVar4;
  long lVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  size_t __nmemb;
  uint uVar11;
  uint uVar12;
  
  iVar1 = pFinal->nObjs;
  pGVar4 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  pFinal->pReprs = pGVar4;
  if (0 < (long)iVar1) {
    lVar5 = 0;
    do {
      pFinal->pReprs[lVar5] = (Gia_Rpr_t)((uint)pFinal->pReprs[lVar5] | 0xfffffff);
      lVar5 = lVar5 + 1;
    } while (lVar5 < pFinal->nObjs);
  }
  if (1 < p->nObjs) {
    lVar5 = 1;
    lVar8 = 5;
    do {
      if ((((uint)p->pReprs[lVar5] & 0xfffffff) == 0) &&
         (uVar11 = *(uint *)(&p->pObjs->field_0x0 + lVar8 * 4), uVar11 != 0xffffffff)) {
        if ((int)uVar11 < 0) {
LAB_001fe7a3:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (pNew->nObjs <= (int)(uVar11 >> 1)) {
LAB_001fe784:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar11 = pNew->pObjs[uVar11 >> 1].Value;
        if ((int)uVar11 < 0) goto LAB_001fe7a3;
        if (1 < uVar11) {
          pFinal->pReprs[uVar11 >> 1] = (Gia_Rpr_t)((uint)pFinal->pReprs[uVar11 >> 1] & 0xf0000000);
        }
      }
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 3;
    } while (lVar5 < p->nObjs);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_00->pArray = piVar6;
  if (1 < p->nObjs) {
    uVar10 = 1;
    do {
      if ((((uint)p->pReprs[uVar10] & 0xfffffff) == 0xfffffff) && (0 < p->pNexts[uVar10])) {
        p_00->nSize = 0;
        if (p->pNexts[uVar10] < 1) {
          __assert_fail("Gia_ObjIsHead(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,899,"void Gia_ManEquivDeriveReprs(Gia_Man_t *, Gia_Man_t *, Gia_Man_t *)");
        }
        uVar7 = uVar10 & 0xffffffff;
        do {
          if (p->nObjs <= (int)uVar7) goto LAB_001fe784;
          uVar11 = p->pObjs[uVar7].Value;
          if (uVar11 != 0xffffffff) {
            if ((int)uVar11 < 0) goto LAB_001fe7a3;
            if (pNew->nObjs <= (int)(uVar11 >> 1)) goto LAB_001fe784;
            uVar11 = pNew->pObjs[uVar11 >> 1].Value;
            if ((int)uVar11 < 0) goto LAB_001fe7a3;
            uVar11 = uVar11 >> 1;
            if (0 < (long)p_00->nSize) {
              lVar5 = 0;
              do {
                if (p_00->pArray[lVar5] == uVar11) goto LAB_001fe6a1;
                lVar5 = lVar5 + 1;
              } while (p_00->nSize != lVar5);
            }
            Vec_IntPush(p_00,uVar11);
          }
LAB_001fe6a1:
          puVar3 = (uint *)(p->pNexts + uVar7);
          uVar7 = (ulong)*puVar3;
        } while (0 < (int)*puVar3);
        __nmemb = (size_t)p_00->nSize;
        if (1 < (long)__nmemb) {
          puVar3 = (uint *)p_00->pArray;
          qsort(puVar3,__nmemb,4,Vec_IntSortCompare1);
          uVar11 = *puVar3;
          sVar9 = 1;
          uVar12 = uVar11;
          do {
            uVar2 = puVar3[sVar9];
            if ((uVar11 != 0xfffffff) && ((int)uVar2 <= (int)uVar11)) {
              __assert_fail("Num == GIA_VOID || Num < Id",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x400,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
            }
            pFinal->pReprs[(int)uVar2] =
                 (Gia_Rpr_t)((uint)pFinal->pReprs[(int)uVar2] & 0xf0000000 | uVar11 & 0xfffffff);
            if ((int)uVar2 <= (int)uVar12) {
              __assert_fail("iPrev < iNode",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                            ,0x392,
                            "void Gia_ManEquivDeriveReprs(Gia_Man_t *, Gia_Man_t *, Gia_Man_t *)");
            }
            sVar9 = sVar9 + 1;
            uVar12 = uVar2;
          } while (__nmemb != sVar9);
        }
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)p->nObjs);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  piVar6 = Gia_ManDeriveNexts(pFinal);
  pFinal->pNexts = piVar6;
  return;
}

Assistant:

void Gia_ManEquivDeriveReprs( Gia_Man_t * p, Gia_Man_t * pNew, Gia_Man_t * pFinal )
{
    Vec_Int_t * vClass;
    Gia_Obj_t * pObj, * pObjNew;
    int i, k, iNode, iRepr, iPrev;
    // start representatives
    pFinal->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pFinal) );
    for ( i = 0; i < Gia_ManObjNum(pFinal); i++ )
        Gia_ObjSetRepr( pFinal, i, GIA_VOID );
    // iterate over constant candidates
    Gia_ManForEachConst( p, i )
    {
        pObj = Gia_ManObj( p, i );
        if ( !~pObj->Value )
            continue;
        pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        if ( Abc_Lit2Var(pObjNew->Value) == 0 )
            continue;
        Gia_ObjSetRepr( pFinal, Abc_Lit2Var(pObjNew->Value), 0 );
    }
    // iterate over class candidates
    vClass = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( p, i )
    {
        Vec_IntClear( vClass );
        Gia_ClassForEachObj( p, i, k )
        {
            pObj = Gia_ManObj( p, k );
            if ( !~pObj->Value )
                continue;
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
            Vec_IntPushUnique( vClass, Abc_Lit2Var(pObjNew->Value) );
        }
        if ( Vec_IntSize( vClass ) < 2 )
            continue;
        Vec_IntSort( vClass, 0 );
        iRepr = iPrev = Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntryStart( vClass, iNode, k, 1 )
        {
            Gia_ObjSetRepr( pFinal, iNode, iRepr );
            assert( iPrev < iNode );
            iPrev = iNode;
        }
    }
    Vec_IntFree( vClass );
    pFinal->pNexts = Gia_ManDeriveNexts( pFinal );
}